

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O3

void easysrc_free(void)

{
  slist_wc_free_all(easysrc_decl);
  easysrc_decl = (slist_wc *)0x0;
  slist_wc_free_all(easysrc_data);
  easysrc_data = (slist_wc *)0x0;
  slist_wc_free_all(easysrc_code);
  easysrc_code = (slist_wc *)0x0;
  slist_wc_free_all(easysrc_toohard);
  easysrc_toohard = (slist_wc *)0x0;
  slist_wc_free_all(easysrc_clean);
  easysrc_clean = (slist_wc *)0x0;
  return;
}

Assistant:

static void easysrc_free(void)
{
  slist_wc_free_all(easysrc_decl);
  easysrc_decl = NULL;
  slist_wc_free_all(easysrc_data);
  easysrc_data = NULL;
  slist_wc_free_all(easysrc_code);
  easysrc_code = NULL;
  slist_wc_free_all(easysrc_toohard);
  easysrc_toohard = NULL;
  slist_wc_free_all(easysrc_clean);
  easysrc_clean = NULL;
}